

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManTestStruct(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vLeaves;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  word *pTruth;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int LutNDecomp [8];
  int LutCount [8];
  int local_68 [12];
  ulong local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[10] = 0;
  local_68[0xb] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  piVar3 = (int *)malloc(400);
  vLeaves->pArray = piVar3;
  Gia_ObjComputeTruthTableStart(p,7);
  if (1 < p->nObjs) {
    lVar9 = 1;
    do {
      iVar2 = p->vMapping->nSize;
      if (iVar2 <= lVar9) {
LAB_00215e69:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = p->vMapping->pArray;
      uVar1 = piVar3[lVar9];
      if ((ulong)uVar1 != 0) {
        if (((int)uVar1 < 0) || (iVar2 <= (int)uVar1)) goto LAB_00215e69;
        uVar1 = piVar3[uVar1];
        lVar10 = (long)(int)uVar1;
        if (7 < lVar10) {
          __assert_fail("nFanins <= 7",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x9cd,"void Gia_ManTestStruct(Gia_Man_t *)");
        }
        uVar4 = 5;
        if (5 < (int)uVar1) {
          uVar4 = (ulong)uVar1;
        }
        local_68[uVar4 + 8] = local_68[uVar4 + 8] + 1;
        if (5 < (int)uVar1) {
          vLeaves->nSize = 0;
          pVVar6 = p->vMapping;
          lVar5 = (long)pVVar6->nSize;
          if (lVar5 <= lVar9) goto LAB_00215e69;
          lVar8 = 0;
          while( true ) {
            piVar3 = pVVar6->pArray;
            lVar7 = (long)piVar3[lVar9];
            if ((lVar7 < 0) || ((int)lVar5 <= piVar3[lVar9])) goto LAB_00215e69;
            if (piVar3[lVar7] <= lVar8) break;
            Vec_IntPush(vLeaves,piVar3[lVar7 + lVar8 + 1]);
            lVar8 = lVar8 + 1;
            pVVar6 = p->vMapping;
            lVar5 = (long)pVVar6->nSize;
            if (lVar5 <= lVar9) goto LAB_00215e69;
          }
          if (p->nObjs <= lVar9) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pTruth = Gia_ObjComputeTruthTableCut(p,p->pObjs + lVar9,vLeaves);
          iVar2 = If_CutPerformCheck07((If_Man_t *)0x0,(uint *)pTruth,7,uVar1,(char *)0x0);
          if ((iVar2 != 1) && (iVar2 = local_68[lVar10], local_68[lVar10] = iVar2 + 1, iVar2 < 10))
          {
            Kit_DsdPrintFromTruth((uint *)pTruth,uVar1);
            putchar(10);
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->nObjs);
  }
  Gia_ObjComputeTruthTableStop(p);
  printf("LUT5 = %d    ",local_38 >> 0x20);
  iVar2 = 1;
  if (1 < (int)uStack_30) {
    iVar2 = (int)uStack_30;
  }
  printf("LUT6 = %d  NonDec = %d (%.2f %%)    ",
         SUB84(((double)local_68[6] * 100.0) / (double)iVar2,0));
  iVar2 = 1;
  if (1 < uStack_30._4_4_) {
    iVar2 = uStack_30._4_4_;
  }
  printf("LUT7 = %d  NonDec = %d (%.2f %%)    ",
         SUB84(((double)local_68[7] * 100.0) / (double)iVar2,0));
  putchar(10);
  return;
}

Assistant:

void Gia_ManTestStruct( Gia_Man_t * p )
{
    int nCutMax = 7;
    int LutCount[8] = {0}, LutNDecomp[8] = {0};
    int i, k, iFan, nFanins, Status;
    Vec_Int_t * vLeaves;
    word * pTruth;

    vLeaves = Vec_IntAlloc( 100 );
    Gia_ObjComputeTruthTableStart( p, nCutMax );
    Gia_ManForEachLut( p, i )
    {
        nFanins = Gia_ObjLutSize(p, i);
        assert( nFanins <= 7 );
        LutCount[Abc_MaxInt(nFanins, 5)]++;
        if ( nFanins <= 5 )
            continue;
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, i, iFan, k )
            Vec_IntPush( vLeaves, iFan );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, i), vLeaves );
        // check if it is decomposable
        Status = If_CutPerformCheck07( NULL, (unsigned *)pTruth, 7, nFanins, NULL );
        if ( Status == 1 )
            continue;
        LutNDecomp[nFanins]++;
        if ( LutNDecomp[nFanins] > 10 )
            continue;
        Kit_DsdPrintFromTruth( (unsigned *)pTruth, nFanins ); printf( "\n" );
    }
    Gia_ObjComputeTruthTableStop( p );

    printf( "LUT5 = %d    ", LutCount[5] );
    printf( "LUT6 = %d  NonDec = %d (%.2f %%)    ", LutCount[6], LutNDecomp[6], 100.0 * LutNDecomp[6]/Abc_MaxInt(LutCount[6], 1) );
    printf( "LUT7 = %d  NonDec = %d (%.2f %%)    ", LutCount[7], LutNDecomp[7], 100.0 * LutNDecomp[7]/Abc_MaxInt(LutCount[7], 1) );
    printf( "\n" );
}